

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hoa.hpp
# Opt level: O1

double __thiscall
ear::hoa::sph_harm<double(*)(int,int)>(hoa *this,int n,int m,double az,double el,norm_f_t *norm)

{
  int m_00;
  undefined4 in_register_00000014;
  uint uVar1;
  policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
  *in_R8;
  longdouble in_ST0;
  longdouble in_ST1;
  double dVar2;
  undefined1 local_81;
  longdouble local_80;
  double local_70;
  double local_68;
  uint local_5c;
  double local_58;
  double local_40;
  longdouble local_38;
  longdouble local_2c;
  
  m_00 = (int)norm;
  local_70 = el;
  if (n < 1) {
    if (n < 0) {
      local_68 = sin((double)n * az);
      local_68 = local_68 * -1.4142135623730951;
    }
    else {
      local_68 = 1.0;
    }
  }
  else {
    local_68 = cos((double)n * az);
    local_68 = local_68 * 1.4142135623730951;
  }
  uVar1 = -n;
  if (0 < n) {
    uVar1 = n;
  }
  local_58 = (double)(*(code *)CONCAT44(in_register_00000014,m))((ulong)this & 0xffffffff,uVar1);
  dVar2 = sin(local_70);
  local_80 = (longdouble)CONCAT28(local_80._8_2_,dVar2);
  local_70 = pow(-1.0,(double)(int)uVar1);
  local_40 = local_80._0_8_;
  local_80 = (longdouble)local_80._0_8_;
  local_5c = uVar1;
  powl();
  boost::math::detail::
  legendre_p_imp<long_double,boost::math::policies::policy<boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
            ((longdouble *)((ulong)this & 0xffffffff),(detail *)(ulong)uVar1,(int)&local_81,m_00,
             local_80,in_ST0,in_R8);
  local_2c = ABS(in_ST1);
  dVar2 = 0.0;
  local_38 = (longdouble)1.79769313486232e+308;
  if (local_38 < local_2c) {
    local_80 = in_ST1;
    boost::math::policies::detail::raise_error<std::overflow_error,double>
              ("boost::math::legendre_p<%1%>(int, int, %1%)","numeric overflow");
    dVar2 = (double)local_80;
    in_ST1 = local_80;
  }
  if (local_2c <= local_38) {
    dVar2 = (double)in_ST1;
  }
  return local_68 * local_58 * local_70 * dVar2;
}

Assistant:

double sph_harm(int n, int m, double az, double el, NormT norm) {
      double scale;
      if (m > 0)
        scale = std::sqrt(2.0) * std::cos(m * az);
      else if (m < 0)
        scale = -std::sqrt(2.0) * std::sin(m * az);
      else
        scale = 1;

      return norm(n, std::abs(m)) * Alegendre(n, std::abs(m), std::sin(el)) *
             scale;
    }